

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O1

void __kmp_task_reduction_init_copy<kmp_taskred_input>
               (kmp_info_t *thr,int num,kmp_taskred_input *data,kmp_taskgroup_t *tg,
               void *reduce_data)

{
  undefined8 *__dest;
  long lVar1;
  undefined8 *puVar2;
  
  __dest = (undefined8 *)___kmp_thread_malloc(thr,(long)num * 0x48);
  memcpy(__dest,reduce_data,(long)num * 0x48);
  if (0 < num) {
    lVar1 = 0;
    puVar2 = __dest;
    do {
      *puVar2 = *(undefined8 *)((long)&data->reduce_shar + lVar1);
      puVar2 = puVar2 + 9;
      lVar1 = lVar1 + 0x38;
    } while ((ulong)(uint)num * 0x38 - lVar1 != 0);
  }
  tg->reduce_data = __dest;
  tg->reduce_num_data = num;
  return;
}

Assistant:

void __kmp_task_reduction_init_copy(kmp_info_t *thr, int num, T *data,
                                    kmp_taskgroup_t *tg, void *reduce_data) {
  kmp_taskred_data_t *arr;
  KA_TRACE(20, ("__kmp_task_reduction_init_copy: Th %p, init taskgroup %p,"
                " from data %p\n",
                thr, tg, reduce_data));
  arr = (kmp_taskred_data_t *)__kmp_thread_malloc(
      thr, num * sizeof(kmp_taskred_data_t));
  // threads will share private copies, thunk routines, sizes, flags, etc.:
  KMP_MEMCPY(arr, reduce_data, num * sizeof(kmp_taskred_data_t));
  for (int i = 0; i < num; ++i) {
    arr[i].reduce_shar = data[i].reduce_shar; // init unique shared pointers
  }
  tg->reduce_data = (void *)arr;
  tg->reduce_num_data = num;
}